

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O1

bool __thiscall
dap::
BasicTypeInfo<dap::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::deserialize(BasicTypeInfo<dap::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *this,Deserializer *d,void *ptr)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> v;
  undefined1 *local_30;
  undefined8 local_28;
  undefined1 local_20;
  undefined7 uStack_1f;
  
  local_28 = 0;
  local_20 = 0;
  local_30 = &local_20;
  iVar1 = (*d->_vptr_Deserializer[5])(d,&local_30);
  if ((char)iVar1 != '\0') {
    std::__cxx11::string::_M_assign((string *)ptr);
    *(undefined1 *)((long)ptr + 0x20) = 1;
  }
  if (local_30 != &local_20) {
    operator_delete(local_30,CONCAT71(uStack_1f,local_20) + 1);
  }
  return true;
}

Assistant:

inline bool deserialize(const Deserializer* d, void* ptr) const override {
    return d->deserialize(reinterpret_cast<T*>(ptr));
  }